

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::(anonymous_namespace)::
     TestIterators<long,flatbuffers::Vector<long,unsigned_int>>
               (vector<long,_std::allocator<long>_> *expected,Vector<long,_unsigned_int> *tested)

{
  const_iterator expval;
  bool bVar1;
  long expval_00;
  size_type_conflict val;
  const_reference pvVar2;
  value_type_conflict5 expval_01;
  value_type *e_1;
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
  local_a0;
  const_reverse_iterator it_1;
  value_type *e;
  VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> local_88;
  const_iterator it;
  size_t k;
  Vector<long,_unsigned_int> local_70 [8];
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
  local_68;
  VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> local_60;
  Vector<long,_unsigned_int> local_58 [8];
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
  local_50;
  VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> local_48;
  Vector<long,_unsigned_int> local_40 [8];
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
  local_38;
  VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> local_30;
  Vector<long,_unsigned_int> local_28 [8];
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
  local_20;
  Vector<long,_unsigned_int> *local_18;
  Vector<long,_unsigned_int> *tested_local;
  vector<long,_std::allocator<long>_> *expected_local;
  
  local_18 = tested;
  tested_local = (Vector<long,_unsigned_int> *)expected;
  Vector<long,_unsigned_int>::rbegin(local_28);
  std::
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>::
  base(&local_20);
  Vector<long,_unsigned_int>::end((Vector<long,_unsigned_int> *)&local_30);
  bVar1 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator==
                    (&local_20.current,&local_30);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'tested.rbegin().base() == tested.end()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x4d2,"");
  Vector<long,_unsigned_int>::crbegin(local_40);
  std::
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>::
  base(&local_38);
  Vector<long,_unsigned_int>::cend((Vector<long,_unsigned_int> *)&local_48);
  bVar1 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator==
                    (&local_38.current,&local_48);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'tested.crbegin().base() == tested.cend()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x4d3,"");
  Vector<long,_unsigned_int>::rend(local_58);
  std::
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>::
  base(&local_50);
  Vector<long,_unsigned_int>::begin((Vector<long,_unsigned_int> *)&local_60);
  bVar1 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator==
                    (&local_50.current,&local_60);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'tested.rend().base() == tested.begin()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x4d4,"");
  Vector<long,_unsigned_int>::crend(local_70);
  std::
  reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>::
  base(&local_68);
  Vector<long,_unsigned_int>::cbegin((Vector<long,_unsigned_int> *)&k);
  bVar1 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator==
                    (&local_68.current,
                     (VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> *)&k);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'tested.crend().base() == tested.cbegin()\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                    ,0x4d5,"");
  it.data_ = (uchar *)0x0;
  Vector<long,_unsigned_int>::begin((Vector<long,_unsigned_int> *)&local_88);
  while( true ) {
    Vector<long,_unsigned_int>::end((Vector<long,_unsigned_int> *)&e);
    bVar1 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator!=
                      (&local_88,
                       (VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int> *)&e);
    expval = it;
    if (!bVar1) break;
    it_1.
    super_reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
    .current.data_ =
         (reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
          )std::vector<long,_std::allocator<long>_>::at
                     ((vector<long,_std::allocator<long>_> *)tested_local,
                      (size_type_conflict)it.data_);
    expval_00 = VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator*
                          (&local_88);
    TestEq<long,long>(expval_00,
                      *(long *)it_1.
                               super_reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
                               .current.data_,"\'*it\' != \'e\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                      ,0x4da,"");
    VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>::operator++(&local_88);
    it.data_ = it.data_ + 1;
  }
  val = std::vector<long,_std::allocator<long>_>::size
                  ((vector<long,_std::allocator<long>_> *)tested_local);
  TestEq<unsigned_long,unsigned_long>
            ((unsigned_long)expval.data_,val,"\'k\' != \'expected.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x4dc,"");
  it.data_ = (uchar *)std::vector<long,_std::allocator<long>_>::size
                                ((vector<long,_std::allocator<long>_> *)tested_local);
  Vector<long,_unsigned_int>::rbegin((Vector<long,_unsigned_int> *)&local_a0);
  while( true ) {
    Vector<long,_unsigned_int>::rend((Vector<long,_unsigned_int> *)&e_1);
    bVar1 = std::operator!=(&local_a0,
                            (reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
                             *)&e_1);
    if (!bVar1) break;
    pvVar2 = std::vector<long,_std::allocator<long>_>::at
                       ((vector<long,_std::allocator<long>_> *)tested_local,
                        (size_type_conflict)(it.data_ + -1));
    expval_01 = VectorReverseIterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
                ::operator*((VectorReverseIterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
                             *)&local_a0);
    TestEq<long,long>(expval_01,*pvVar2,"\'*it\' != \'e\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                      ,0x4e1,"");
    std::
    reverse_iterator<flatbuffers::VectorIterator<long,_long,_const_unsigned_char_*,_unsigned_int>_>
    ::operator++(&local_a0);
    it.data_ = it.data_ + -1;
  }
  TestEq<unsigned_long,int>
            ((unsigned_long)it.data_,0,"\'k\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
             ,0x4e3,"");
  return;
}

Assistant:

void TestIterators(const std::vector<T> &expected, const Container &tested) {
  TEST_ASSERT(tested.rbegin().base() == tested.end());
  TEST_ASSERT(tested.crbegin().base() == tested.cend());
  TEST_ASSERT(tested.rend().base() == tested.begin());
  TEST_ASSERT(tested.crend().base() == tested.cbegin());

  size_t k = 0;
  for (auto it = tested.begin(); it != tested.end(); ++it, ++k) {
    const auto &e = expected.at(k);
    TEST_EQ(*it, e);
  }
  TEST_EQ(k, expected.size());

  k = expected.size();
  for (auto it = tested.rbegin(); it != tested.rend(); ++it, --k) {
    const auto &e = expected.at(k - 1);
    TEST_EQ(*it, e);
  }
  TEST_EQ(k, 0);
}